

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_scaled_termination(OSQPWorkspace *work,c_int scaled_termination_new)

{
  char *in_RSI;
  long in_RDI;
  c_int local_8;
  
  if (in_RDI == 0) {
    local_8 = _osqp_error(0,in_RSI);
  }
  else if ((in_RSI == (char *)0x0) || (in_RSI == (char *)0x1)) {
    *(char **)(*(long *)(in_RDI + 0xb8) + 0x90) = in_RSI;
    local_8 = 0;
  }
  else {
    printf("ERROR in %s: ","osqp_update_scaled_termination");
    printf("scaled_termination should be either 0 or 1");
    printf("\n");
    local_8 = 1;
  }
  return local_8;
}

Assistant:

c_int osqp_update_scaled_termination(OSQPWorkspace *work, c_int scaled_termination_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that scaled_termination is either 0 or 1
  if ((scaled_termination_new != 0) && (scaled_termination_new != 1)) {
#ifdef PRINTING
    c_eprint("scaled_termination should be either 0 or 1");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update scaled_termination
  work->settings->scaled_termination = scaled_termination_new;

  return 0;
}